

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O1

void __thiscall
asio::detail::epoll_reactor::
add_timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue)

{
  mutex *__mutex;
  
  if ((this->mutex_).enabled_ == true) {
    __mutex = &(this->mutex_).mutex_;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    (queue->super_timer_queue_base).next_ = (this->timer_queues_).first_;
    (this->timer_queues_).first_ = &queue->super_timer_queue_base;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  (queue->super_timer_queue_base).next_ = (this->timer_queues_).first_;
  (this->timer_queues_).first_ = &queue->super_timer_queue_base;
  return;
}

Assistant:

void epoll_reactor::add_timer_queue(timer_queue<Time_Traits>& queue)
{
  do_add_timer_queue(queue);
}